

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

Preface * __thiscall ASDCP::MXF::Preface::InitFromTLVSet(Preface *this,TLVReader *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_LastModifiedDate);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Preface_Version);
    TLVReader::ReadUi16(&local_80,in_RDX,(ui16_t *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ObjectModelVersion);
    TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_PrimaryPackage);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_Identifications);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ContentStorage);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Core_OperationalPattern);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Core_EssenceContainers);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Preface_DMSchemes);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ApplicationSchemes);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    *(bool *)&TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK
    ;
  }
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ConformsToSpecifications);
    TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    *(bool *)&TLVSet[8].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK
    ;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Preface::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, LastModifiedDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(Preface, Version));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(Preface, ObjectModelVersion));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, PrimaryPackage));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, Identifications));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, ContentStorage));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, OperationalPattern));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, EssenceContainers));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, DMSchemes));
  if ( ASDCP_SUCCESS(result) ) 
    {
      result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, ApplicationSchemes));
      ApplicationSchemes.set_has_value( result == RESULT_OK);
    }
  if ( ASDCP_SUCCESS(result) )
    {
      result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, ConformsToSpecifications));
      ConformsToSpecifications.set_has_value( result == RESULT_OK);
    }
  return result;
}